

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::array_table(spec *s)

{
  sequence *in_RDI;
  char (*in_stack_ffffffffffffff38) [3];
  literal *in_stack_ffffffffffffff40;
  key *this;
  scanner_base in_stack_ffffffffffffff58;
  scanner_base in_stack_ffffffffffffff60;
  key *in_stack_ffffffffffffff68;
  repeat_at_least *in_stack_ffffffffffffff70;
  spec *in_stack_ffffffffffffff78;
  sequence *in_stack_ffffffffffffff80;
  spec *in_stack_ffffffffffffff88;
  key *in_stack_ffffffffffffff90;
  
  literal::literal<3ul>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  ws(in_stack_ffffffffffffff78);
  key::key(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  ws(in_stack_ffffffffffffff78);
  this = (key *)&stack0xffffffffffffff58;
  literal::literal<3ul>((literal *)this,in_stack_ffffffffffffff38);
  sequence::
  sequence<toml::detail::literal,toml::detail::repeat_at_least,toml::detail::syntax::key,toml::detail::repeat_at_least,toml::detail::literal>
            (in_stack_ffffffffffffff80,(literal *)in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (repeat_at_least *)in_stack_ffffffffffffff60._vptr_scanner_base,
             (literal *)in_stack_ffffffffffffff58._vptr_scanner_base);
  literal::~literal((literal *)0x717240);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  key::~key(this);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  literal::~literal((literal *)0x71726e);
  return in_RDI;
}

Assistant:

TOML11_INLINE sequence array_table(const spec& s)
{
    return sequence(literal("[["), ws(s), key(s), ws(s), literal("]]"));
}